

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_processor.h
# Opt level: O3

string * __thiscall
sentencepiece::SentencePieceProcessor::DecodeIds_abi_cxx11_
          (string *__return_storage_ptr__,SentencePieceProcessor *this,
          vector<int,_std::allocator<int>_> *ids)

{
  Status status;
  Status local_20;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  (*this->_vptr_SentencePieceProcessor[0x11])(&local_20,this,ids,__return_storage_ptr__);
  util::Status::~Status(&local_20);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string DecodeIds(const std::vector<int> &ids) const {
    DEFINE_SPP_DIRECT_FUNC_IMPL(Decode, std::string, ids);
  }